

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 HUF_selectDecoder(size_t dstSize,size_t cSrcSize)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  if (dstSize == 0) {
    __assert_fail("dstSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9317,"U32 HUF_selectDecoder(size_t, size_t)");
  }
  if (dstSize < 0x20001) {
    if (cSrcSize < dstSize) {
      uVar1 = (ulong)(uint)((int)cSrcSize << 4) / (dstSize & 0xffffffff);
    }
    else {
      uVar1 = 0xf;
    }
    iVar2 = (int)(dstSize >> 8);
    uVar3 = iVar2 * algoTime[uVar1][1].decode256Time + algoTime[uVar1][1].tableTime;
    return (U32)((uVar3 >> 5) + uVar3 <
                algoTime[uVar1][0].decode256Time * iVar2 + algoTime[uVar1][0].tableTime);
  }
  __assert_fail("dstSize <= 128*1024",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9318,"U32 HUF_selectDecoder(size_t, size_t)");
}

Assistant:

U32 HUF_selectDecoder (size_t dstSize, size_t cSrcSize)
{
    assert(dstSize > 0);
    assert(dstSize <= 128*1024);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dstSize;
    (void)cSrcSize;
    return 0;
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dstSize;
    (void)cSrcSize;
    return 1;
#else
    /* decoder timing evaluation */
    {   U32 const Q = (cSrcSize >= dstSize) ? 15 : (U32)(cSrcSize * 16 / dstSize);   /* Q < 16 */
        U32 const D256 = (U32)(dstSize >> 8);
        U32 const DTime0 = algoTime[Q][0].tableTime + (algoTime[Q][0].decode256Time * D256);
        U32 DTime1 = algoTime[Q][1].tableTime + (algoTime[Q][1].decode256Time * D256);
        DTime1 += DTime1 >> 5;  /* small advantage to algorithm using less memory, to reduce cache eviction */
        return DTime1 < DTime0;
    }
#endif
}